

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::Parse(Parser *this)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  pointer pMVar6;
  int iVar7;
  allocator local_349;
  string local_348;
  int local_324;
  vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_> *local_320;
  vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_> *local_318;
  vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_> *local_310;
  vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_> *local_308;
  uint fmt;
  
  local_320 = &this->m_vCameras;
  local_318 = &this->m_vLights;
  local_310 = &this->m_vDummies;
  local_308 = &this->m_vMeshes;
  iVar7 = 0;
LAB_003cd3f2:
  do {
    while( true ) {
      pcVar2 = this->filePtr;
      cVar1 = *pcVar2;
      if (cVar1 == '*') break;
      if (cVar1 == '{') {
        iVar7 = iVar7 + 1;
      }
      else if (cVar1 == '}') {
        iVar7 = iVar7 + -1;
        if (iVar7 == 0) {
          this->filePtr = pcVar2 + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (cVar1 == '\0') {
        return;
      }
LAB_003cd475:
      bVar3 = false;
      uVar5 = (uint)(byte)*this->filePtr;
      if ((uVar5 < 0xe) && ((0x3401U >> (uVar5 & 0x1f) & 1) != 0)) {
        if (this->bLastWasEndLine == false) {
          this->iLineNumber = this->iLineNumber + 1;
          bVar3 = true;
        }
        else {
          bVar3 = false;
        }
      }
      this->bLastWasEndLine = bVar3;
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = pcVar2 + 1;
    bVar3 = TokenMatch<char_const>(&this->filePtr,"3DSMAX_ASCIIEXPORT",0x12);
    if (bVar3) {
      local_324 = iVar7;
      ParseLV4MeshLong(this,&fmt);
      uVar5 = fmt;
      if (fmt < 0xc9) break;
      LogWarning(this,
                 "Unknown file format version: *3DSMAX_ASCIIEXPORT should                                be <= 200"
                );
      goto LAB_003cd4da;
    }
    bVar3 = TokenMatch<char_const>(&this->filePtr,"SCENE",5);
    if (!bVar3) {
      bVar3 = TokenMatch<char_const>(&this->filePtr,"GROUP",5);
      if (bVar3) {
        Parse(this);
      }
      else {
        bVar3 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_LIST",0xd);
        if (!bVar3) {
          bVar3 = TokenMatch<char_const>(&this->filePtr,"GEOMOBJECT",10);
          if (bVar3) {
            std::__cxx11::string::string((string *)&local_348,"UNNAMED",&local_349);
            ASE::Mesh::Mesh((Mesh *)&fmt,&local_348);
            std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>::
            emplace_back<Assimp::ASE::Mesh>(local_308,(Mesh *)&fmt);
            ASE::Mesh::~Mesh((Mesh *)&fmt);
            std::__cxx11::string::~string((string *)&local_348);
            pMVar6 = (this->m_vMeshes).
                     super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            lVar4 = -0x288;
          }
          else {
            bVar3 = TokenMatch<char_const>(&this->filePtr,"HELPEROBJECT",0xc);
            if (bVar3) {
              Dummy::Dummy((Dummy *)&fmt);
              std::vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>::
              emplace_back<Assimp::ASE::Dummy>(local_310,(Dummy *)&fmt);
              BaseNode::~BaseNode((BaseNode *)&fmt);
              pMVar6 = (pointer)(this->m_vDummies).
                                super__Vector_base<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
              lVar4 = -0x158;
            }
            else {
              bVar3 = TokenMatch<char_const>(&this->filePtr,"LIGHTOBJECT",0xb);
              if (bVar3) {
                std::__cxx11::string::string((string *)&local_348,"UNNAMED",&local_349);
                Light::Light((Light *)&fmt,&local_348);
                std::vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>::
                emplace_back<Assimp::ASE::Light>(local_318,(Light *)&fmt);
                BaseNode::~BaseNode((BaseNode *)&fmt);
                std::__cxx11::string::~string((string *)&local_348);
                pMVar6 = (pointer)(this->m_vLights).
                                  super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                lVar4 = -0x170;
              }
              else {
                bVar3 = TokenMatch<char_const>(&this->filePtr,"CAMERAOBJECT",0xc);
                if (!bVar3) {
                  bVar3 = TokenMatch<char_const>(&this->filePtr,"COMMENT",7);
                  if (!bVar3) {
                    if ((this->iFileFormat < 200) &&
                       (bVar3 = TokenMatch<char_const>(&this->filePtr,"MESH_SOFTSKINVERTS",0x12),
                       bVar3)) {
                      ParseLV1SoftSkinBlock(this);
                    }
                    goto LAB_003cd475;
                  }
                  std::__cxx11::string::string((string *)&fmt,"<unknown>",(allocator *)&local_348);
                  ParseString(this,(string *)&fmt,"*COMMENT");
                  std::operator+(&local_348,"Comment: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&fmt);
                  LogInfo(this,local_348._M_dataplus._M_p);
                  std::__cxx11::string::~string((string *)&local_348);
                  std::__cxx11::string::~string((string *)&fmt);
                  goto LAB_003cd3f2;
                }
                std::__cxx11::string::string((string *)&local_348,"UNNAMED",&local_349);
                Camera::Camera((Camera *)&fmt,&local_348);
                std::vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>::
                emplace_back<Assimp::ASE::Camera>(local_320,(Camera *)&fmt);
                BaseNode::~BaseNode((BaseNode *)&fmt);
                std::__cxx11::string::~string((string *)&local_348);
                pMVar6 = (pointer)(this->m_vCameras).
                                  super__Vector_base<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                lVar4 = -0x168;
              }
            }
          }
          ParseLV1ObjectBlock(this,(BaseNode *)
                                   ((long)&(pMVar6->super_MeshWithSmoothingGroups<Assimp::ASE::Face>
                                           ).mPositions.
                                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar4));
          goto LAB_003cd3f2;
        }
        ParseLV1MaterialListBlock(this);
      }
      goto LAB_003cd3f2;
    }
    ParseLV1SceneBlock(this);
  } while( true );
  iVar7 = local_324;
  if (fmt != 0) {
LAB_003cd4da:
    this->iFileFormat = uVar5;
    iVar7 = local_324;
  }
  goto LAB_003cd3f2;
}

Assistant:

void Parser::Parse()
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Version should be 200. Validate this ...
            if (TokenMatch(filePtr,"3DSMAX_ASCIIEXPORT",18))
            {
                unsigned int fmt;
                ParseLV4MeshLong(fmt);

                if (fmt > 200)
                {
                    LogWarning("Unknown file format version: *3DSMAX_ASCIIEXPORT should \
                               be <= 200");
                }
                // *************************************************************
                // - fmt will be 0 if we're unable to read the version number
                // there are some faulty files without a version number ...
                // in this case we'll guess the exact file format by looking
                // at the file extension (ASE, ASK, ASC)
                // *************************************************************

                if ( fmt ) {
                    iFileFormat = fmt;
                }
                continue;
            }
            // main scene information
            if (TokenMatch(filePtr,"SCENE",5))
            {
                ParseLV1SceneBlock();
                continue;
            }
            // "group" - no implementation yet, in facte
            // we're just ignoring them for the moment
            if (TokenMatch(filePtr,"GROUP",5))
            {
                Parse();
                continue;
            }
            // material list
            if (TokenMatch(filePtr,"MATERIAL_LIST",13))
            {
                ParseLV1MaterialListBlock();
                continue;
            }
            // geometric object (mesh)
            if (TokenMatch(filePtr,"GEOMOBJECT",10))

            {
                m_vMeshes.push_back(Mesh("UNNAMED"));
                ParseLV1ObjectBlock(m_vMeshes.back());
                continue;
            }
            // helper object = dummy in the hierarchy
            if (TokenMatch(filePtr,"HELPEROBJECT",12))

            {
                m_vDummies.push_back(Dummy());
                ParseLV1ObjectBlock(m_vDummies.back());
                continue;
            }
            // light object
            if (TokenMatch(filePtr,"LIGHTOBJECT",11))

            {
                m_vLights.push_back(Light("UNNAMED"));
                ParseLV1ObjectBlock(m_vLights.back());
                continue;
            }
            // camera object
            if (TokenMatch(filePtr,"CAMERAOBJECT",12))
            {
                m_vCameras.push_back(Camera("UNNAMED"));
                ParseLV1ObjectBlock(m_vCameras.back());
                continue;
            }
            // comment - print it on the console
            if (TokenMatch(filePtr,"COMMENT",7))
            {
                std::string out = "<unknown>";
                ParseString(out,"*COMMENT");
                LogInfo(("Comment: " + out).c_str());
                continue;
            }
            // ASC bone weights
            if (AI_ASE_IS_OLD_FILE_FORMAT() && TokenMatch(filePtr,"MESH_SOFTSKINVERTS",18))
            {
                ParseLV1SoftSkinBlock();
            }
        }
        AI_ASE_HANDLE_TOP_LEVEL_SECTION();
    }
    return;
}